

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_make_standard_env_op(sexp ctx,sexp self,sexp_sint_t n,sexp version)

{
  sexp env;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  local_28.var = &local_30;
  local_30 = (sexp)0x43e;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  local_30 = sexp_make_primitive_env_op(ctx,self,(sexp_sint_t)local_28.next,version);
  if ((((ulong)local_30 & 3) != 0) || (local_30->tag != 0x13)) {
    local_30 = sexp_load_standard_env(ctx,local_30,(sexp)&DAT_0000000f);
  }
  if ((((ulong)local_30 & 3) == 0) && (local_30->tag == 0x17)) {
    local_30->field_0x5 = local_30->field_0x5 | 1;
  }
  (ctx->value).context.saves = local_28.next;
  return local_30;
}

Assistant:

sexp sexp_make_standard_env_op (sexp ctx, sexp self, sexp_sint_t n, sexp version) {
  sexp_gc_var1(env);
  sexp_gc_preserve1(ctx, env);
  env = sexp_make_primitive_env(ctx, version);
  if (! sexp_exceptionp(env)) env = sexp_load_standard_env(ctx, env, SEXP_SEVEN);
  if (sexp_envp(env)) sexp_immutablep(env) = 1;
  sexp_gc_release1(ctx);
  return env;
}